

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

bool __thiscall CDBWrapper::WriteBatch(CDBWrapper *this,CDBBatch *batch,bool fSync)

{
  bool bVar1;
  size_t sVar2;
  LevelDBContext *pLVar3;
  Level level;
  DB *pDVar4;
  CDBWrapper *category;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  string_view source_file;
  string_view logging_function;
  double mem_after;
  Status status;
  double mem_before;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::LogAcceptCategory((LogFlags)this,(Level)batch);
  mem_before = 0.0;
  if (bVar1) {
    sVar2 = DynamicMemoryUsage(this);
    auVar5._8_4_ = (int)(sVar2 >> 0x20);
    auVar5._0_8_ = sVar2;
    auVar5._12_4_ = 0x45300000;
    mem_before = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625;
  }
  pLVar3 = DBContext(this);
  pDVar4 = pLVar3->pdb;
  pLVar3 = DBContext(this);
  (*pDVar4->_vptr_DB[4])
            (&status,pDVar4,&pLVar3->writeoptions + fSync,
             (batch->m_impl_batch)._M_t.
             super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
             .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl);
  level = (Level)pDVar4;
  HandleError(&status);
  if (bVar1) {
    category = this;
    sVar2 = DynamicMemoryUsage(this);
    auVar6._8_4_ = (int)(sVar2 >> 0x20);
    auVar6._0_8_ = sVar2;
    auVar6._12_4_ = 0x45300000;
    mem_after = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * 0.0009765625 *
                0.0009765625;
    bVar1 = ::LogAcceptCategory((LogFlags)category,level);
    if (bVar1) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "WriteBatch";
      logging_function._M_len = 10;
      LogPrintFormatInternal<std::__cxx11::string,double,double>
                (logging_function,source_file,0x12f,LEVELDB,Debug,
                 (ConstevalFormatString<3U>)0xc8d344,&this->m_name,&mem_before,&mem_after);
    }
  }
  leveldb::Status::~Status(&status);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::WriteBatch(CDBBatch& batch, bool fSync)
{
    const bool log_memory = LogAcceptCategory(BCLog::LEVELDB, BCLog::Level::Debug);
    double mem_before = 0;
    if (log_memory) {
        mem_before = DynamicMemoryUsage() / 1024.0 / 1024;
    }
    leveldb::Status status = DBContext().pdb->Write(fSync ? DBContext().syncoptions : DBContext().writeoptions, &batch.m_impl_batch->batch);
    HandleError(status);
    if (log_memory) {
        double mem_after = DynamicMemoryUsage() / 1024.0 / 1024;
        LogDebug(BCLog::LEVELDB, "WriteBatch memory usage: db=%s, before=%.1fMiB, after=%.1fMiB\n",
                 m_name, mem_before, mem_after);
    }
    return true;
}